

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O3

StringRef llvm::sys::detail::getHostCPUNameForARM(StringRef ProcCpuinfoContent)

{
  long *plVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  ulong uVar5;
  size_type sVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  unsigned_long_long *Result;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  char *__s;
  ulong uVar18;
  StringRef Separator;
  StringRef SVar19;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Str;
  StringRef Chars_02;
  StringRef Str_00;
  StringRef Chars_03;
  StringRef Chars_04;
  StringRef I;
  unsigned_long_long ULLVal;
  SmallVector<llvm::StringRef,_32U> Lines;
  StringRef local_278;
  ulong local_260;
  int *local_258;
  StringRef local_250;
  SmallVectorImpl<llvm::StringRef> local_240;
  undefined1 local_230 [512];
  
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_230;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  Result = (unsigned_long_long *)0xffffffff;
  Separator.Length = 1;
  Separator.Data = "\n";
  StringRef::split(&local_250,&local_240,Separator,-1,true);
  uVar13 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
           0xffffffff;
  sVar9 = 7;
  __s = "generic";
  if (uVar13 != 0) {
    lVar17 = 8;
    uVar18 = 0;
    local_258 = (int *)0x0;
    lVar10 = 0;
    lVar14 = 0;
    uVar16 = 0;
    do {
      uVar5 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
              0xffffffff;
      if (uVar5 <= uVar18) {
LAB_001a356e:
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      if (0xe < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                 super_SmallVectorBase.BeginX + lVar17)) {
        plVar1 = *(long **)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar17 + -8);
        Result = (unsigned_long_long *)0x7265746e656d656c;
        if (*(long *)((long)plVar1 + 7) == 0x7265746e656d656c && *plVar1 == 0x6c706d6920555043) {
          local_278.Data = (char *)((long)plVar1 + 0xf);
          local_278.Length =
               *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar17) - 0xf;
          Chars.Length = 3;
          Chars.Data = "\t :";
          sVar6 = StringRef::find_first_not_of(&local_278,Chars,0);
          if (local_278.Length <= sVar6) {
            sVar6 = local_278.Length;
          }
          lVar10 = local_278.Length - sVar6;
          local_258 = (int *)(sVar6 + (long)local_278.Data);
          uVar5 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                  & 0xffffffff;
        }
      }
      if (uVar5 <= uVar18) goto LAB_001a356e;
      if ((7 < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar17)) &&
         (**(long **)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + lVar17 + -8) == 0x6572617764726148)) {
        local_278.Data =
             (char *)(*(long **)((long)local_240.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + lVar17 + -8) + 1);
        local_278.Length =
             *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                              super_SmallVectorBase.BeginX + lVar17) - 8;
        Chars_00.Length = 3;
        Chars_00.Data = "\t :";
        sVar6 = StringRef::find_first_not_of(&local_278,Chars_00,0);
        if (local_278.Length <= sVar6) {
          sVar6 = local_278.Length;
        }
        uVar16 = local_278.Length - sVar6;
        lVar14 = sVar6 + (long)local_278.Data;
      }
      pvVar2 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar13 != uVar18);
    if (lVar10 == 4) {
      if (*local_258 == 0x31347830) {
        if (6 < uVar16) {
          sVar9 = 10;
          __s = "cortex-a53";
          if ((*(int *)(lVar14 + -4 + uVar16) == 0x34393938 &&
               *(int *)(lVar14 + -7 + uVar16) == 0x384d534d) ||
             (*(int *)(lVar14 + -4 + uVar16) == 0x36393938 &&
              *(int *)(lVar14 + -7 + uVar16) == 0x384d534d)) goto LAB_001a34cf;
        }
        if ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
            0xffffffff) != 0) {
          lVar10 = 0;
          do {
            if ((7 < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>
                                      .super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                      super_SmallVectorBase.BeginX + lVar10 + 8)) &&
               (Result = *(unsigned_long_long **)
                          ((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                 super_SmallVectorBase.BeginX + lVar10),
               *Result == 0x7472617020555043)) {
              local_278.Data = (char *)(Result + 1);
              local_278.Length =
                   *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                    super_SmallVectorBase.BeginX + lVar10 + 8) - 8;
              Chars_04.Length = 3;
              Chars_04.Data = "\t :";
              sVar6 = StringRef::find_first_not_of(&local_278,Chars_04,0);
              if (local_278.Length <= sVar6) {
                sVar6 = local_278.Length;
              }
              if (local_278.Length - sVar6 != 5) goto LAB_001a34bd;
              if (*(char *)((long)local_278.Data + sVar6 + 4) == '6' &&
                  *(int *)((long)local_278.Data + sVar6) == 0x32397830) {
                __s = "arm926ej-s";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '2' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30627830) {
                __s = "mpcore";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '6' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x33627830) {
                __s = "arm1136j-s";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '6' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x35627830) {
                __s = "arm1156t2-s";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '6' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x37627830) {
                __s = "arm1176jz-s";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '8' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30637830) {
                __s = "cortex-a8";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '9' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30637830) {
                __s = "cortex-a9";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == 'f' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30637830) {
                __s = "cortex-a15";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '0' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x32637830) {
                __s = "cortex-m0";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '3' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x32637830) {
                __s = "cortex-m3";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '4' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x32637830) {
                __s = "cortex-m4";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '4' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30647830) {
                __s = "cortex-a35";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '3' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30647830) {
                __s = "cortex-a53";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '7' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30647830) {
                __s = "cortex-a57";
              }
              else if (*(char *)((long)local_278.Data + sVar6 + 4) == '8' &&
                       *(int *)((long)local_278.Data + sVar6) == 0x30647830) {
                __s = "cortex-a72";
              }
              else {
                __s = "generic";
                if (*(char *)((long)local_278.Data + sVar6 + 4) == '9' &&
                    *(int *)((long)local_278.Data + sVar6) == 0x30647830) {
                  __s = "cortex-a73";
                }
              }
              goto LAB_001a34c4;
            }
            lVar10 = lVar10 + 0x10;
          } while ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    _8_8_ & 0xffffffff) << 4 != lVar10);
        }
      }
      if ((*local_258 == 0x31357830) &&
         ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) != 0)) {
        lVar10 = 0;
        do {
          if ((7 < *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                    super_SmallVectorBase.BeginX + lVar10 + 8)) &&
             (Result = *(unsigned_long_long **)
                        ((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + lVar10), *Result == 0x7472617020555043
             )) {
            local_278.Data = (char *)(Result + 1);
            local_278.Length =
                 *(ulong *)((long)local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar10 + 8) - 8;
            Chars_03.Length = 3;
            Chars_03.Data = "\t :";
            sVar6 = StringRef::find_first_not_of(&local_278,Chars_03,0);
            if (local_278.Length <= sVar6) {
              sVar6 = local_278.Length;
            }
            if (local_278.Length - sVar6 == 5) {
              if (*(char *)((long)local_278.Data + sVar6 + 4) == 'f' &&
                  *(int *)((long)local_278.Data + sVar6) == 0x36307830) {
                __s = "krait";
              }
              else {
                __s = "kryo";
                if ((((*(char *)((long)local_278.Data + sVar6 + 4) != '1' ||
                       *(int *)((long)local_278.Data + sVar6) != 0x30327830) &&
                     (*(char *)((long)local_278.Data + sVar6 + 4) != '5' ||
                      *(int *)((long)local_278.Data + sVar6) != 0x30327830)) &&
                    (*(char *)((long)local_278.Data + sVar6 + 4) != '1' ||
                     *(int *)((long)local_278.Data + sVar6) != 0x31327830)) &&
                   ((__s = "cortex-a73",
                    *(char *)((long)local_278.Data + sVar6 + 4) != '0' ||
                    *(int *)((long)local_278.Data + sVar6) != 0x30387830 &&
                    (*(char *)((long)local_278.Data + sVar6 + 4) != '1' ||
                     *(int *)((long)local_278.Data + sVar6) != 0x30387830)))) {
                  if (*(char *)((long)local_278.Data + sVar6 + 4) == '0' &&
                      *(int *)((long)local_278.Data + sVar6) == 0x30637830) {
                    __s = "falkor";
                  }
                  else {
                    __s = "generic";
                    if (*(char *)((long)local_278.Data + sVar6 + 4) == '1' &&
                        *(int *)((long)local_278.Data + sVar6) == 0x30637830) {
                      __s = "saphira";
                    }
                  }
                }
              }
            }
            else {
LAB_001a34bd:
              __s = "generic";
            }
LAB_001a34c4:
            sVar9 = strlen(__s);
            goto LAB_001a34cf;
          }
          lVar10 = lVar10 + 0x10;
        } while ((local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                 & 0xffffffff) << 4 != lVar10);
      }
      __s = "generic";
      sVar9 = 7;
      if (*local_258 == 0x33357830) {
        uVar13 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                 & 0xffffffff;
        if (uVar13 == 0) {
          uVar12 = 0;
          uVar15 = 0;
        }
        else {
          lVar10 = 0;
          iVar11 = 0;
          do {
            local_278.Data = *(char **)((long)pvVar2 + lVar10);
            local_278.Length = ((undefined8 *)((long)pvVar2 + lVar10))[1];
            iVar7 = iVar11;
            if ((10 < local_278.Length) &&
               (*(long *)((long)local_278.Data + 3) == 0x746e616972617620 &&
                *(unsigned_long_long *)local_278.Data == 0x6972617620555043)) {
              local_278.Data = (char *)((long)local_278.Data + 0xb);
              local_278.Length = local_278.Length - 0xb;
              Chars_01.Length = 3;
              Chars_01.Data = "\t :";
              sVar6 = StringRef::find_first_not_of(&local_278,Chars_01,0);
              if (local_278.Length <= sVar6) {
                sVar6 = local_278.Length;
              }
              Str.Data = local_278.Length - sVar6;
              Str.Length = 0;
              bVar4 = getAsUnsignedInteger
                                ((llvm *)(sVar6 + (long)local_278.Data),Str,(uint)&local_260,Result)
              ;
              iVar7 = (int)local_260;
              if (local_260 >> 0x20 != 0) {
                iVar7 = iVar11;
              }
              if (bVar4) {
                iVar7 = iVar11;
              }
            }
            iVar11 = iVar7;
            pvVar3 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX;
            lVar10 = lVar10 + 0x10;
          } while (uVar13 << 4 != lVar10);
          uVar13 = local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   _8_8_ & 0xffffffff;
          uVar12 = iVar11 << 0xc;
          if (uVar13 == 0) {
            uVar15 = 0;
          }
          else {
            lVar10 = 0;
            uVar15 = 0;
            do {
              local_278.Data = *(char **)((long)pvVar3 + lVar10);
              local_278.Length = ((undefined8 *)((long)pvVar3 + lVar10))[1];
              uVar8 = uVar15;
              if ((7 < local_278.Length) &&
                 (*(unsigned_long_long *)local_278.Data == 0x7472617020555043)) {
                local_278.Data = (char *)((long)local_278.Data + 8);
                local_278.Length = local_278.Length - 8;
                Chars_02.Length = 3;
                Chars_02.Data = "\t :";
                sVar6 = StringRef::find_first_not_of(&local_278,Chars_02,0);
                if (local_278.Length <= sVar6) {
                  sVar6 = local_278.Length;
                }
                Str_00.Data = local_278.Length - sVar6;
                Str_00.Length = 0;
                bVar4 = getAsUnsignedInteger
                                  ((llvm *)(sVar6 + (long)local_278.Data),Str_00,(uint)&local_260,
                                   Result);
                uVar8 = (uint)local_260;
                if (local_260 >> 0x20 != 0) {
                  uVar8 = uVar15;
                }
                if (bVar4) {
                  uVar8 = uVar15;
                }
              }
              uVar15 = uVar8;
              lVar10 = lVar10 + 0x10;
            } while (uVar13 << 4 != lVar10);
          }
        }
        __s = "exynos-m1";
        if ((uVar12 | uVar15) == 0x4001) {
          __s = "exynos-m2";
        }
        sVar9 = 9;
      }
    }
    else {
      __s = "generic";
      sVar9 = 7;
    }
  }
LAB_001a34cf:
  if ((undefined1 *)
      local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_230) {
    free(local_240.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  SVar19.Length = sVar9;
  SVar19.Data = __s;
  return SVar19;
}

Assistant:

StringRef sys::detail::getHostCPUNameForARM(StringRef ProcCpuinfoContent) {
  // The cpuid register on arm is not accessible from user space. On Linux,
  // it is exposed through the /proc/cpuinfo file.

  // Read 32 lines from /proc/cpuinfo, which should contain the CPU part line
  // in all cases.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU implementer line.
  StringRef Implementer;
  StringRef Hardware;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("CPU implementer"))
      Implementer = Lines[I].substr(15).ltrim("\t :");
    if (Lines[I].startswith("Hardware"))
      Hardware = Lines[I].substr(8).ltrim("\t :");
  }

  if (Implementer == "0x41") { // ARM Ltd.
    // MSM8992/8994 may give cpu part for the core that the kernel is running on,
    // which is undeterministic and wrong. Always return cortex-a53 for these SoC.
    if (Hardware.endswith("MSM8994") || Hardware.endswith("MSM8996"))
      return "cortex-a53";


    // Look for the CPU part line.
    for (unsigned I = 0, E = Lines.size(); I != E; ++I)
      if (Lines[I].startswith("CPU part"))
        // The CPU part is a 3 digit hexadecimal number with a 0x prefix. The
        // values correspond to the "Part number" in the CP15/c0 register. The
        // contents are specified in the various processor manuals.
        return StringSwitch<const char *>(Lines[I].substr(8).ltrim("\t :"))
            .Case("0x926", "arm926ej-s")
            .Case("0xb02", "mpcore")
            .Case("0xb36", "arm1136j-s")
            .Case("0xb56", "arm1156t2-s")
            .Case("0xb76", "arm1176jz-s")
            .Case("0xc08", "cortex-a8")
            .Case("0xc09", "cortex-a9")
            .Case("0xc0f", "cortex-a15")
            .Case("0xc20", "cortex-m0")
            .Case("0xc23", "cortex-m3")
            .Case("0xc24", "cortex-m4")
            .Case("0xd04", "cortex-a35")
            .Case("0xd03", "cortex-a53")
            .Case("0xd07", "cortex-a57")
            .Case("0xd08", "cortex-a72")
            .Case("0xd09", "cortex-a73")
            .Default("generic");
  }

  if (Implementer == "0x51") // Qualcomm Technologies, Inc.
    // Look for the CPU part line.
    for (unsigned I = 0, E = Lines.size(); I != E; ++I)
      if (Lines[I].startswith("CPU part"))
        // The CPU part is a 3 digit hexadecimal number with a 0x prefix. The
        // values correspond to the "Part number" in the CP15/c0 register. The
        // contents are specified in the various processor manuals.
        return StringSwitch<const char *>(Lines[I].substr(8).ltrim("\t :"))
            .Case("0x06f", "krait") // APQ8064
            .Case("0x201", "kryo")
            .Case("0x205", "kryo")
            .Case("0x211", "kryo")
            .Case("0x800", "cortex-a73")
            .Case("0x801", "cortex-a73")
            .Case("0xc00", "falkor")
            .Case("0xc01", "saphira")
            .Default("generic");

  if (Implementer == "0x53") { // Samsung Electronics Co., Ltd.
    // The Exynos chips have a convoluted ID scheme that doesn't seem to follow
    // any predictive pattern across variants and parts.
    unsigned Variant = 0, Part = 0;

    // Look for the CPU variant line, whose value is a 1 digit hexadecimal
    // number, corresponding to the Variant bits in the CP15/C0 register.
    for (auto I : Lines)
      if (I.consume_front("CPU variant"))
        I.ltrim("\t :").getAsInteger(0, Variant);

    // Look for the CPU part line, whose value is a 3 digit hexadecimal
    // number, corresponding to the PartNum bits in the CP15/C0 register.
    for (auto I : Lines)
      if (I.consume_front("CPU part"))
        I.ltrim("\t :").getAsInteger(0, Part);

    unsigned Exynos = (Variant << 12) | Part;
    switch (Exynos) {
    default:
      // Default by falling through to Exynos M1.
      LLVM_FALLTHROUGH;

    case 0x1001:
      return "exynos-m1";

    case 0x4001:
      return "exynos-m2";
    }
  }

  return "generic";
}